

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O1

pair<const_int_*,_const_int_*> __thiscall
frozen::unordered_set<int,_1UL,_frozen::elsa<int>,_std::equal_to<int>_>::equal_range<int>
          (unordered_set<int,_1UL,_frozen::elsa<int>,_std::equal_to<int>_> *this,int *key)

{
  int *piVar1;
  size_t sVar2;
  long lVar3;
  int *piVar4;
  pair<const_int_*,_const_int_*> pVar5;
  
  sVar2 = bits::pmh_tables<2ul,frozen::elsa<int>>::lookup<int,frozen::elsa<int>>
                    ((pmh_tables<2ul,frozen::elsa<int>> *)&this->tables_,key,
                     (elsa<int> *)&this->tables_);
  if ((sVar2 == 1) || ((&this->keys_)[sVar2].data_[0] != *key)) {
    lVar3 = 4;
  }
  else {
    lVar3 = sVar2 << 2;
  }
  piVar4 = (int *)((long)(&this->keys_ + 1) + lVar3);
  piVar1 = (int *)((long)(this->keys_).data_ + lVar3);
  if (lVar3 == 4) {
    piVar4 = (int *)&this->field_0x4;
    piVar1 = (int *)&this->field_0x4;
  }
  pVar5.second = piVar4;
  pVar5.first = piVar1;
  return pVar5;
}

Assistant:

constexpr std::pair<const_iterator, const_iterator> equal_range(KeyType const &key) const {
    auto const it = find(key);
    if (it != end())
      return {it, it + 1};
    else
      return {keys_.end(), keys_.end()};
  }